

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe10At1(uint8_t *buf)

{
  return (ulong)((uint)(buf[1] >> 5) + (*buf & 0x7f) * 8);
}

Assistant:

std::uint64_t readFlUIntBe10At1(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 3;
    res |= (buf[1] >> 5);
    res &= UINT64_C(0x3ff);
    return res;
}